

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

void __thiscall
optimization::graph_color::Conflict_Map::delete_edge(Conflict_Map *this,VarId *var1,VarId *var2)

{
  size_t sVar1;
  size_t sVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *p_Var5;
  mapped_type *pmVar6;
  size_type sVar7;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *p_Var8;
  key_type_conflict kVar9;
  key_type_conflict kVar10;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *pmVar11;
  undefined4 uVar12;
  VarId *__x;
  map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *this_00;
  VarId *__k;
  key_type_conflict local_8c;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *local_88;
  VarId *local_80;
  VarId *local_78;
  size_t local_70;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_68;
  
  pmVar11 = &this->dynamic_Map;
  sVar3 = std::
          map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::count(pmVar11,var1);
  if ((sVar3 != 0) &&
     (sVar3 = std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::count(pmVar11,var2), sVar3 != 0)) {
    pmVar4 = std::
             map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::operator[](pmVar11,var1);
    sVar1 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_88 = pmVar11;
    pmVar4 = std::
             map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::operator[](pmVar11,var2);
    sVar2 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    this_00 = &this->edge_vars;
    uVar12 = (undefined4)sVar1;
    local_68._M_impl._0_4_ = uVar12;
    p_Var5 = &std::
              map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](this_00,(key_type_conflict *)&local_68)->_M_t;
    local_80 = var1;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::erase(p_Var5,var1);
    kVar10 = (key_type_conflict)sVar2;
    local_68._M_impl._0_4_ = kVar10;
    p_Var5 = &std::
              map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](this_00,(key_type_conflict *)&local_68)->_M_t;
    local_78 = var2;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::erase(p_Var5,var2);
    local_70 = sVar1;
    local_68._M_impl._0_4_ = uVar12;
    pmVar6 = std::
             map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::operator[](this_00,(key_type_conflict *)&local_68);
    if ((pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      local_68._M_impl._0_4_ = SUB84(local_70,0);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::erase(&this_00->_M_t,(key_type_conflict *)&local_68);
    }
    local_68._M_impl._0_4_ = kVar10;
    sVar7 = std::
            map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::count(this_00,(key_type_conflict *)&local_68);
    pmVar11 = local_88;
    __x = local_78;
    __k = local_80;
    if ((sVar7 != 0) &&
       (local_8c = kVar10,
       pmVar6 = std::
                map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                ::operator[](this_00,&local_8c), __x = local_78, __k = local_80, pmVar11 = local_88,
       (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
      local_68._M_impl._0_4_ = kVar10;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::erase(&this_00->_M_t,(key_type_conflict *)&local_68);
    }
    p_Var5 = &std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](pmVar11,__k)->_M_t;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::erase(p_Var5,__x);
    p_Var5 = &std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](pmVar11,__x)->_M_t;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::erase(p_Var5,__k);
    if (local_70 != 0) {
      kVar9 = (int)local_70 - 1;
      local_68._M_impl._0_4_ = kVar9;
      sVar7 = std::
              map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::count(this_00,(key_type_conflict *)&local_68);
      if (sVar7 == 0) {
        local_68._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_68._M_impl.super__Rb_tree_header._M_header;
        local_68._M_impl._0_8_ = 0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_8c = kVar9;
        local_68._M_impl.super__Rb_tree_header._M_header._M_right =
             local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var5 = &std::
                  map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](this_00,&local_8c)->_M_t;
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::operator=(p_Var5,&local_68);
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_68);
      }
      p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)std::
                  map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](this_00,(key_type_conflict *)&local_68);
      std::
      _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
      ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,__k);
    }
    if (sVar2 != 0) {
      kVar10 = kVar10 - 1;
      local_68._M_impl._0_4_ = kVar10;
      sVar7 = std::
              map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::count(this_00,(key_type_conflict *)&local_68);
      if (sVar7 == 0) {
        local_68._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_68._M_impl.super__Rb_tree_header._M_header;
        local_68._M_impl._0_8_ = 0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_8c = kVar10;
        local_68._M_impl.super__Rb_tree_header._M_header._M_right =
             local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var5 = &std::
                  map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](this_00,&local_8c)->_M_t;
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::operator=(p_Var5,&local_68);
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_68);
      }
      p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)std::
                  map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](this_00,(key_type_conflict *)&local_68);
      std::
      _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
      ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,__x);
    }
    return;
  }
  __assert_fail("dynamic_Map.count(var1) && dynamic_Map.count(var2)",
                "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                ,0xaa,
                "void optimization::graph_color::Conflict_Map::delete_edge(mir::inst::VarId, mir::inst::VarId)"
               );
}

Assistant:

void delete_edge(mir::inst::VarId var1, mir::inst::VarId var2) {
    assert(dynamic_Map.count(var1) && dynamic_Map.count(var2));
    auto size1 = dynamic_Map[var1].size();
    auto size2 = dynamic_Map[var2].size();
    edge_vars[size1].erase(var1);
    edge_vars[size2].erase(var2);
    if (!edge_vars[size1].size()) {
      edge_vars.erase(size1);
    }
    if (edge_vars.count(size2) && !edge_vars[size2].size()) {
      edge_vars.erase(size2);
    }
    dynamic_Map[var1].erase(var2);
    dynamic_Map[var2].erase(var1);
    if (size1 >= 1) {
      if (!edge_vars.count(size1 - 1)) {
        edge_vars[size1 - 1] = std::set<mir::inst::VarId>();
      }
      edge_vars[size1 - 1].insert(var1);
    }
    if (size2 >= 1) {
      if (!edge_vars.count(size2 - 1)) {
        edge_vars[size2 - 1] = std::set<mir::inst::VarId>();
      }
      edge_vars[size2 - 1].insert(var2);
    }
  }